

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::DoConvert<int,float>(Thread *this,Ptr *out_trap)

{
  float fVar1;
  
  fVar1 = Pop<float>(this);
  if (NAN(fVar1)) {
    DoConvert<int,float>();
  }
  else {
    if ((-2.1474836e+09 <= fVar1) && (fVar1 < 2.1474836e+09)) {
      Push<int>(this,(int)fVar1);
      return Ok;
    }
    DoConvert<int,float>();
  }
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}